

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermAlgebra.cpp
# Opt level: O3

bool __thiscall Shell::TermAlgebra::emptyDomain(TermAlgebra *this)

{
  bool bVar1;
  ulong n;
  
  if (this->_n != 0) {
    if (this->_allowsCyclicTerms == false) {
      n = 0;
      do {
        if ((this->_constrs)._capacity <= n) {
          Lib::Array<Shell::TermAlgebraConstructor_*>::expandToFit(&this->_constrs,n);
        }
        bVar1 = TermAlgebraConstructor::recursive((this->_constrs)._array[n]);
      } while ((bVar1) && (n = n + 1, n < this->_n));
    }
    else {
      bVar1 = false;
    }
    return bVar1;
  }
  return true;
}

Assistant:

bool TermAlgebra::emptyDomain()
{
  if (_n == 0) {
    return true;
  }

  if (_allowsCyclicTerms) {
    return false;
  }

  for (unsigned i = 0; i < _n; i++) {
    if (!(_constrs[i]->recursive())) {
      return false;
    }
  }
  return true;
}